

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int htmlTokenizerTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  void *__ptr;
  size_t sVar2;
  long lVar3;
  char *data;
  htmlParserCtxtPtr ctxt;
  uint local_88;
  int counter;
  int ret;
  uint size;
  uint dataState;
  uint testNum;
  char *temp;
  FILE *input;
  char startTag [31];
  int local_40 [2];
  xmlTokenizerConfig config;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  ctxt._4_4_ = 0;
  nb_tests = nb_tests + 1;
  config.startTag._4_4_ = options;
  _dataState = resultFilename(filename,temp_directory,".res");
  if (_dataState == (char *)0x0) {
    fprintf(_stderr,"out of memory\n");
    fatalError();
  }
  SAXdebug = (FILE *)fopen64(_dataState,"wb");
  if ((FILE *)SAXdebug == (FILE *)0x0) {
    fprintf(_stderr,"Failed to write to %s\n",_dataState);
    free(_dataState);
    filename_local._4_4_ = 0xffffffff;
  }
  else {
    temp = (char *)fopen64(filename,"rb");
    if ((FILE *)temp == (FILE *)0x0) {
      fprintf(_stderr,"%s: failed to open\n",filename);
      filename_local._4_4_ = 0xffffffff;
    }
    else {
      while (iVar1 = __isoc99_fscanf(temp,"%u %30s %u %u%*1[\n]",&size,&input,&ret,&counter),
            3 < iVar1) {
        ctxt._4_4_ = ctxt._4_4_ + 1;
        fprintf((FILE *)SAXdebug,"%d\n");
        __ptr = (void *)(*_xmlMalloc)(counter + 1);
        sVar2 = fread(__ptr,1,(ulong)(uint)counter,(FILE *)temp);
        if (sVar2 != (uint)counter) {
          fprintf(_stderr,"%s:%d: unexpected eof\n",filename,(ulong)ctxt._4_4_);
          return -1;
        }
        lVar3 = htmlCreatePushParserCtxt(&tokenizeHtmlSAXHandler,0,0,0,0,1);
        local_40[0] = ret;
        config._0_8_ = &input;
        local_40[1] = 0;
        *(int **)(lVar3 + 0x1a8) = local_40;
        *(undefined4 *)(lVar3 + 0x110) = 0x11;
        htmlCtxtUseOptions(lVar3,config.startTag._4_4_ | 2);
        htmlParseChunk(lVar3,__ptr,counter,1);
        htmlFreeParserCtxt(lVar3);
        (*_xmlFree)(__ptr);
      }
      iVar1 = feof((FILE *)temp);
      if (iVar1 == 0) {
        fprintf(_stderr,"%s:%d: invalid format\n",filename,(ulong)ctxt._4_4_);
        filename_local._4_4_ = 0xffffffff;
      }
      else {
        fclose((FILE *)temp);
        fclose((FILE *)SAXdebug);
        iVar1 = compareFiles(_dataState,result);
        if (iVar1 != 0) {
          fprintf(_stderr,"Got a difference for %s\n",filename);
        }
        local_88 = (uint)(iVar1 != 0);
        if (_dataState != (char *)0x0) {
          unlink(_dataState);
          free(_dataState);
        }
        filename_local._4_4_ = local_88;
      }
    }
  }
  return filename_local._4_4_;
}

Assistant:

static int
htmlTokenizerTest(const char *filename, const char *result,
                  const char *err ATTRIBUTE_UNUSED,
                  int options) {
    xmlTokenizerConfig config;
    char startTag[31];
    FILE *input;
    char *temp;
    unsigned testNum, dataState, size;
    int ret = 0, counter = 0;

    nb_tests++;
    temp = resultFilename(filename, temp_directory, ".res");
    if (temp == NULL) {
        fprintf(stderr, "out of memory\n");
        fatalError();
    }

    SAXdebug = fopen(temp, "wb");
    if (SAXdebug == NULL) {
        fprintf(stderr, "Failed to write to %s\n", temp);
	free(temp);
	return(-1);
    }

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr, "%s: failed to open\n", filename);
        return(-1);
    }

    while (fscanf(input, "%u %30s %u %u%*1[\n]",
                  &testNum, startTag, &dataState, &size) >= 4) {
        htmlParserCtxtPtr ctxt;
        char *data;

        fprintf(SAXdebug, "%d\n", counter++);

        data = xmlMalloc(size + 1);
        if (fread(data, 1, size, input) != size) {
            fprintf(stderr, "%s:%d: unexpected eof\n", filename, counter);
            return(-1);
        }

        ctxt = htmlCreatePushParserCtxt(&tokenizeHtmlSAXHandler, NULL, NULL, 0,
                                        NULL, XML_CHAR_ENCODING_UTF8);
        config.dataState = dataState;
        config.startTag = BAD_CAST startTag;
        config.inCharacters = 0;
        ctxt->_private = &config;
        /* Skip charset auto-detection */
        ctxt->instate = XML_PARSER_XML_DECL;
        htmlCtxtUseOptions(ctxt, options | HTML_PARSE_HTML5);
        htmlParseChunk(ctxt, data, size, 1);
        htmlFreeParserCtxt(ctxt);

        xmlFree(data);
    }
    if (!feof(input)) {
        fprintf(stderr, "%s:%d: invalid format\n", filename, counter);
        return(-1);
    }

    fclose(input);
    fclose(SAXdebug);

    if (compareFiles(temp, result)) {
        fprintf(stderr, "Got a difference for %s\n", filename);
        ret = 1;
    }

    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    return(ret);
}